

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FundamentalOperationalData.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::FundamentalOperationalData::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,FundamentalOperationalData *this)

{
  ostream *poVar1;
  KStringStream ss;
  stringstream local_190 [16];
  ostream local_180 [376];
  
  std::__cxx11::stringstream::stringstream(local_190);
  poVar1 = std::operator<<(local_180,"FundamentalOperationalData:");
  std::operator<<(poVar1,"\tNOT IMPLEMENTED YET\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

KString FundamentalOperationalData::GetAsString() const
{
    KStringStream ss;

    ss << "FundamentalOperationalData:"
       << "\tNOT IMPLEMENTED YET\n";

    // TODO: Get string for a specific system type.

    return ss.str();
}